

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *pNode)

{
  short sVar1;
  int iVar2;
  int local_20;
  int local_1c;
  int Counter;
  int i;
  Dsd_Node_t *pNode_local;
  
  local_20 = 0;
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x167,"int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    if (-1 < pNode->nVisits) {
      sVar1 = pNode->nVisits;
      pNode->nVisits = sVar1 + 1;
      if (sVar1 == 0) {
        if (pNode->nDecs < 2) {
          pNode_local._4_4_ = 0;
        }
        else {
          for (local_1c = 0; local_1c < pNode->nDecs; local_1c = local_1c + 1) {
            iVar2 = Dsd_TreeCountNonTerminalNodes_rec
                              ((Dsd_Node_t *)((ulong)pNode->pDecs[local_1c] & 0xfffffffffffffffe));
            local_20 = iVar2 + local_20;
          }
          pNode_local._4_4_ = local_20 + 1;
        }
      }
      else {
        pNode_local._4_4_ = 0;
      }
      return pNode_local._4_4_;
    }
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x169,"int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *)");
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdTree.c"
                ,0x168,"int Dsd_TreeCountNonTerminalNodes_rec(Dsd_Node_t *)");
}

Assistant:

int Dsd_TreeCountNonTerminalNodes_rec( Dsd_Node_t * pNode )
{
    int i;
    int Counter = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits >= 0 );

    if ( pNode->nVisits++ ) // if this is not the first visit, return zero
        return 0;

    if ( pNode->nDecs <= 1 )
        return 0;

    // upon the first visit, go through the list of successors and call recursively 
    for ( i = 0; i < pNode->nDecs; i++ )
        Counter += Dsd_TreeCountNonTerminalNodes_rec( Dsd_Regular(pNode->pDecs[i]) );

    return Counter + 1;
}